

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

int __thiscall
QAccessibleMdiArea::indexOfChild(QAccessibleMdiArea *this,QAccessibleInterface *child)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  QMdiArea *pQVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QList<QMdiSubWindow_*> local_58;
  QList<QMdiSubWindow_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = true;
  if (child == (QAccessibleInterface *)0x0) {
LAB_00527722:
    bVar2 = false;
  }
  else {
    lVar4 = (**(code **)(*(long *)child + 0x18))(child);
    if (lVar4 == 0) goto LAB_00527722;
    pQVar5 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    QMdiArea::subWindowList(&local_40,pQVar5,CreationOrder);
    bVar9 = local_40.d.size == 0;
    bVar2 = true;
  }
  if ((bVar2) && (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
    }
  }
  lVar4 = 0xffffffff;
  iVar8 = -1;
  if (bVar9) goto LAB_005277fd;
  (**(code **)(*(long *)child + 0x18))(child);
  lVar6 = QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
  if (lVar6 == 0) goto LAB_005277fd;
  pQVar5 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  QMdiArea::subWindowList(&local_58,pQVar5,CreationOrder);
  if (local_58.d.size == 0) {
LAB_005277d5:
    iVar8 = -1;
  }
  else {
    lVar7 = -8;
    do {
      iVar8 = (int)lVar4;
      lVar1 = local_58.d.size * -8 + lVar7;
      if (lVar1 == -8) goto LAB_005277cf;
      lVar4 = lVar7 + 8;
      lVar3 = lVar7 + 8;
      lVar7 = lVar4;
    } while (*(long *)((long)local_58.d.ptr + lVar3) != lVar6);
    iVar8 = (int)(lVar4 >> 3);
LAB_005277cf:
    if (lVar1 == -8) goto LAB_005277d5;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_005277fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMdiArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || mdiArea()->subWindowList().isEmpty())
        return -1;
    if (QMdiSubWindow *window = qobject_cast<QMdiSubWindow *>(child->object())) {
        return mdiArea()->subWindowList().indexOf(window);
    }
    return -1;
}